

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TTypeList * __thiscall
glslang::TParseContext::recordStructCopy
          (TParseContext *this,TStructRecord *record,TType *originType,TType *tmpType)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  TType *this_00;
  TType *this_01;
  _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
  *this_02;
  int iVar4;
  TTypeList *pTVar5;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar6;
  const_reference pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  iterator iVar10;
  iterator iVar11;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  *p_Var12;
  mapped_type *this_03;
  mapped_type *ppTVar13;
  ulong uVar14;
  size_t i;
  size_type __n;
  ulong uVar15;
  TTypeList *originStruct;
  _Base_ptr local_98;
  ulong local_90;
  TType *local_88;
  TType *local_80;
  _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
  *local_78;
  size_type local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  local_68;
  
  local_88 = originType;
  local_80 = tmpType;
  local_78 = &record->_M_t;
  pTVar5 = TType::getStruct(tmpType);
  this_01 = local_80;
  local_70 = (long)(pTVar5->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar5->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar15 = 0;
  uVar14 = 0;
  for (__n = 0; this_00 = local_88, local_70 != __n; __n = __n + 1) {
    pvVar6 = &TType::getStruct(local_88)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar6,__n);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    bVar1 = *(byte *)(CONCAT44(extraout_var,iVar4) + 0x10);
    pvVar6 = &TType::getStruct(this_00)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar6,__n);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    uVar3 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8);
    pvVar6 = &TType::getStruct(this_01)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar6,__n);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    bVar2 = *(byte *)(CONCAT44(extraout_var_01,iVar4) + 0x10);
    pvVar6 = &TType::getStruct(this_01)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar6,__n);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    uVar14 = ((uVar3 >> 0x3d) + (ulong)(bVar1 & 0xf) ^ uVar14) * 2;
    uVar15 = ((*(ulong *)(CONCAT44(extraout_var_02,iVar4) + 8) >> 0x3d) + (ulong)(bVar2 & 0xf) ^
             uVar15) * 2;
  }
  local_90 = uVar15;
  p_Var8 = (_Base_ptr)TType::getStruct(local_88);
  local_98 = p_Var8;
  p_Var9 = (_Base_ptr)TType::getStruct(local_80);
  this_02 = local_78;
  if (uVar14 != uVar15) {
    iVar10 = std::
             _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
             ::find(local_78,(key_type *)&local_98);
    if ((_Rb_tree_header *)iVar10._M_node == &(this_02->_M_impl).super__Rb_tree_header) {
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl._0_8_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 = &std::
                 map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                 ::operator[]((map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                               *)this_02,(key_type *)&local_98)->_M_t;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
      ::_M_move_assign(p_Var12,&local_68);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
      ::~_Rb_tree(&local_68);
    }
    else {
      iVar11 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
               ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                       *)&iVar10._M_node[1]._M_parent,&local_90);
      if (iVar11._M_node != (_Base_ptr)&iVar10._M_node[1]._M_left) {
        return (TTypeList *)iVar11._M_node[1]._M_parent;
      }
    }
    this_03 = std::
              map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
              ::operator[]((map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                            *)this_02,(key_type *)&local_98);
    ppTVar13 = std::
               map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
               ::operator[](this_03,&local_90);
    *ppTVar13 = (mapped_type)p_Var9;
    p_Var8 = p_Var9;
  }
  return (TTypeList *)p_Var8;
}

Assistant:

const TTypeList* TParseContext::recordStructCopy(TStructRecord& record, const TType* originType, const TType* tmpType)
{
    size_t memberCount = tmpType->getStruct()->size();
    size_t originHash = 0, tmpHash = 0;
    std::hash<size_t> hasher;
    for (size_t i = 0; i < memberCount; i++) {
        size_t originMemberHash = hasher(originType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                         originType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        size_t tmpMemberHash = hasher(tmpType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                      tmpType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        originHash = hasher((originHash ^ originMemberHash) << 1);
        tmpHash = hasher((tmpHash ^ tmpMemberHash) << 1);
    }
    const TTypeList* originStruct = originType->getStruct();
    const TTypeList* tmpStruct = tmpType->getStruct();
    if (originHash != tmpHash) {
        auto fixRecords = record.find(originStruct);
        if (fixRecords != record.end()) {
            auto fixRecord = fixRecords->second.find(tmpHash);
            if (fixRecord != fixRecords->second.end()) {
                return fixRecord->second;
            } else {
                record[originStruct][tmpHash] = tmpStruct;
                return tmpStruct;
            }
        } else {
            record[originStruct] = std::map<size_t, const TTypeList*>();
            record[originStruct][tmpHash] = tmpStruct;
            return tmpStruct;
        }
    }
    return originStruct;
}